

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

int smlEscapeQuotedString(uchar *out,int *outlen,xmlChar *in,int *inlen)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  undefined1 *puVar5;
  char c;
  uchar *inend;
  uchar *outend;
  uchar *base;
  uchar *outstart;
  int *inlen_local;
  xmlChar *in_local;
  int *outlen_local;
  uchar *out_local;
  
  iVar2 = *outlen;
  iVar3 = *inlen;
  inlen_local = (int *)in;
  outlen_local = (int *)out;
  do {
    if (in + iVar3 <= inlen_local || out + iVar2 <= outlen_local) {
      *outlen = (int)outlen_local - (int)out;
      *inlen = (int)inlen_local - (int)in;
      return 0;
    }
    piVar4 = (int *)((long)inlen_local + 1);
    cVar1 = (char)*inlen_local;
    if ((cVar1 == '\\') || (cVar1 == '\"')) {
      if (out + iVar2 <= (int *)((long)outlen_local + 1U)) {
        return -1;
      }
      *(undefined1 *)outlen_local = 0x5c;
      outlen_local = (int *)((long)outlen_local + 1);
    }
    inlen_local = piVar4;
    if (cVar1 == '&') {
      *(undefined1 *)outlen_local = 0x26;
      *(undefined1 *)((long)outlen_local + 1) = 0x61;
      *(undefined1 *)((long)outlen_local + 2) = 0x6d;
      piVar4 = outlen_local + 1;
      *(undefined1 *)((long)outlen_local + 3) = 0x70;
      outlen_local = (int *)((long)outlen_local + 5);
      *(undefined1 *)piVar4 = 0x3b;
    }
    else if (cVar1 == '<') {
      *(undefined1 *)outlen_local = 0x26;
      *(undefined1 *)((long)outlen_local + 1) = 0x6c;
      puVar5 = (undefined1 *)((long)outlen_local + 3);
      *(undefined1 *)((long)outlen_local + 2) = 0x74;
      outlen_local = outlen_local + 1;
      *puVar5 = 0x3b;
    }
    else if (cVar1 == '>') {
      *(undefined1 *)outlen_local = 0x26;
      *(undefined1 *)((long)outlen_local + 1) = 0x67;
      puVar5 = (undefined1 *)((long)outlen_local + 3);
      *(undefined1 *)((long)outlen_local + 2) = 0x74;
      outlen_local = outlen_local + 1;
      *puVar5 = 0x3b;
    }
    else {
      *(char *)outlen_local = cVar1;
      outlen_local = (int *)((long)outlen_local + 1);
    }
  } while( true );
}

Assistant:

static int
smlEscapeQuotedString(unsigned char* out, int *outlen,
		      const xmlChar* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    unsigned char* outend = out + *outlen;
    const unsigned char* inend = in + *inlen;

    /* Escape the \ and " characters */
    while ((in < inend) && (out < outend)) {
    	char c = *in++;
    	if (c == '\\' || c == '"') {
    	    if ((out+1) >= outend) return -1;
	    *out++ = '\\';
    	}
	/* TODO FOR SML: Convert characters not in the output encoding to &#NNN entities */
	switch(c) {
	case '&':
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	    break;
	case '<':
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	    break;
	case '>':
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	    break;
	default:
	    *out++ = c;
	    break;
	}
    }
    *outlen = out - outstart;
    *inlen = in - base;
    return(0);
}